

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Caliper.cpp
# Opt level: O2

void __thiscall
cali::Caliper::push_snapshot_replace
          (Caliper *this,ChannelBody *chB,SnapshotView trigger_info,Entry *target)

{
  SnapshotBuilder *rec;
  ThreadData *pTVar1;
  ThreadData *pTVar2;
  SnapshotView local_58;
  SnapshotView local_48;
  Caliper *local_38;
  
  pTVar1 = this->sT;
  (pTVar1->lock).m_lock = (pTVar1->lock).m_lock + 1;
  (pTVar1->snapshot).m_builder.m_data = (pTVar1->snapshot).m_data;
  (pTVar1->snapshot).m_builder.m_capacity = 0x78;
  (pTVar1->snapshot).m_builder.m_len = 0;
  (pTVar1->snapshot).m_builder.m_skipped = 0;
  pTVar2 = this->sT;
  rec = &(pTVar2->snapshot).m_builder;
  local_58.m_data = trigger_info.m_data;
  local_58.m_len = trigger_info.m_len;
  Blackboard::snapshot(&pTVar2->thread_blackboard,rec);
  ThreadData::update_process_snapshot
            (this->sT,&this->sG->process_blackboard,&this->sG->process_blackboard_lock);
  SnapshotBuilder::append
            (rec,(this->sT->process_snapshot).m_builder.m_len,
             (this->sT->process_snapshot).m_builder.m_data);
  SnapshotBuilder::remove(rec,(char *)target);
  SnapshotBuilder::append(rec,trigger_info.m_len,trigger_info.m_data);
  local_48.m_data = (Entry *)this;
  util::callback<void(cali::Caliper*,cali::SnapshotView,cali::SnapshotBuilder&)>::operator()
            ((callback<void(cali::Caliper*,cali::SnapshotView,cali::SnapshotBuilder&)> *)
             &(chB->events).snapshot,(Caliper **)&local_48,&local_58,rec);
  local_48.m_data = (pTVar2->snapshot).m_builder.m_data;
  local_48.m_len = (pTVar2->snapshot).m_builder.m_len;
  local_38 = this;
  util::callback<void(cali::Caliper*,cali::SnapshotView,cali::SnapshotView)>::operator()
            ((callback<void(cali::Caliper*,cali::SnapshotView,cali::SnapshotView)> *)
             &(chB->events).process_snapshot,&local_38,&local_58,&local_48);
  (pTVar1->lock).m_lock = (pTVar1->lock).m_lock + -1;
  return;
}

Assistant:

void Caliper::push_snapshot_replace(ChannelBody* chB, SnapshotView trigger_info, const Entry& target)
{
    std::lock_guard<::siglock> g(sT->lock);

    sT->snapshot.reset();
    SnapshotBuilder& rec = sT->snapshot.builder();

    sT->thread_blackboard.snapshot(rec);
    sT->update_process_snapshot(sG->process_blackboard, sG->process_blackboard_lock);
    rec.append(sT->process_snapshot.view());

    // remove/replace target entry from blackboard snapshot
    rec.remove(target);
    rec.append(trigger_info);

    chB->events.snapshot(this, trigger_info, rec);
    chB->events.process_snapshot(this, trigger_info, rec.view());
}